

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcEllipseProfileDef::IfcEllipseProfileDef(IfcEllipseProfileDef *this)

{
  *(undefined ***)&this->field_0x90 = &PTR__Object_007631c0;
  *(undefined8 *)&this->field_0x98 = 0;
  *(char **)&this->field_0xa0 = "IfcEllipseProfileDef";
  IfcParameterizedProfileDef::IfcParameterizedProfileDef
            (&this->super_IfcParameterizedProfileDef,&PTR_construction_vtable_24__007b86b8);
  *(undefined8 *)&(this->super_IfcParameterizedProfileDef).field_0x78 = 0;
  (this->super_IfcParameterizedProfileDef).super_IfcProfileDef.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>._vptr_ObjectHelper =
       (_func_int **)0x7b8628;
  *(undefined8 *)&this->field_0x90 = 0x7b86a0;
  *(undefined8 *)&(this->super_IfcParameterizedProfileDef).super_IfcProfileDef.field_0x58 = 0x7b8650
  ;
  *(undefined8 *)&(this->super_IfcParameterizedProfileDef).field_0x70 = 0x7b8678;
  return;
}

Assistant:

IfcEllipseProfileDef() : Object("IfcEllipseProfileDef") {}